

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratches.cpp
# Opt level: O0

bool test_scratches(void)

{
  code *pcVar1;
  initializer_list<int> __l;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference __b;
  reference piVar5;
  ostream *poVar6;
  iterator iStack_90;
  int item;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_70;
  int cur;
  int last_nonzero_idx;
  allocator<int> local_59;
  int local_58 [10];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> nums;
  
  local_58[4] = 9;
  local_58[5] = 0x17;
  local_58[6] = 0x22;
  local_58[7] = 0x38;
  local_58[0] = 1;
  local_58[1] = 3;
  local_58[2] = 4;
  local_58[3] = 6;
  local_30 = local_58;
  local_28 = 8;
  std::allocator<int>::allocator(&local_59);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_59);
  std::allocator<int>::~allocator(&local_59);
  local_70 = 0;
  __range1._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_20);
    if (sVar3 <= (ulong)(long)__range1._4_4_) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_20,(long)__range1._4_4_);
    if (*pvVar4 % 2 == 0) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_20,(long)local_70);
      __b = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_20,(long)__range1._4_4_);
      std::swap<int>(pvVar4,__b);
      local_70 = local_70 + 1;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_20);
  iStack_90 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_20);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff70);
    if (!bVar2) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar6," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool test_scratches(){
    vector<int> nums{1,3,4,6,9,23,34,56};
    for(int last_nonzero_idx=0,cur=0;cur < nums.size();cur++){
        if(nums[cur] %2 == 0)
            swap(nums[last_nonzero_idx++],nums[cur]);
    }

    for (int item:nums){
        cout << item << " ";
    }
}